

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall adios2::transport::FileStdio::WaitForOpen(FileStdio *this)

{
  bool bVar1;
  _IO_FILE *p_Var2;
  char *in_RDI;
  size_t in_stack_00000140;
  char *in_stack_00000148;
  FileStdio *in_stack_00000150;
  string *in_stack_00000178;
  FileStdio *in_stack_00000180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_48 [8];
  future<_IO_FILE_*> *in_stack_ffffffffffffffc0;
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_RDI[0xf8] & 1U) != 0) {
    bVar1 = std::__basic_future<_IO_FILE_*>::valid((__basic_future<_IO_FILE_*> *)0xd4f371);
    if (bVar1) {
      p_Var2 = std::future<_IO_FILE_*>::get(in_stack_ffffffffffffffc0);
      *(_IO_FILE **)(in_RDI + 0xf0) = p_Var2;
    }
    in_RDI[0xf8] = '\0';
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::operator+(in_stack_ffffffffffffffa8,in_RDI);
    CheckFile(in_stack_00000180,in_stack_00000178);
    std::__cxx11::string::~string(local_28);
    std::__cxx11::string::~string(local_48);
    in_RDI[0x6c] = '\x01';
    if ((in_RDI[0x110] & 1U) != 0) {
      SetBuffer(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    }
  }
  return;
}

Assistant:

void FileStdio::WaitForOpen()
{
    if (m_IsOpening)
    {
        if (m_OpenFuture.valid())
        {
            m_File = m_OpenFuture.get();
        }
        m_IsOpening = false;
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to POSIX open");
        m_IsOpen = true;
        if (m_DelayedBufferSet)
        {
            SetBuffer(m_DelayedBuffer, m_DelayedBufferSize);
        }
    }
}